

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

char * bson_iter_symbol(bson_iter_t *iter,uint32_t *length)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  int iVar4;
  
  if (iter != (bson_iter_t *)0x0) {
    puVar1 = iter->raw;
    if (puVar1[iter->type] == '\x0e') {
      puVar2 = puVar1 + iter->d2;
      iVar4 = 1;
      if (1 < *(int *)(puVar1 + iter->d1)) {
        iVar4 = *(int *)(puVar1 + iter->d1);
      }
      uVar3 = iVar4 - 1;
    }
    else {
      puVar2 = (uint8_t *)0x0;
      uVar3 = 0;
    }
    if (length != (uint32_t *)0x0) {
      *length = uVar3;
    }
    return (char *)puVar2;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x603,"bson_iter_symbol","iter");
  abort();
}

Assistant:

const char *
bson_iter_symbol (const bson_iter_t *iter, /* IN */
                  uint32_t *length)        /* OUT */
{
   const char *ret = NULL;
   uint32_t ret_length = 0;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_SYMBOL) {
      ret = (const char *) (iter->raw + iter->d2);
      ret_length = bson_iter_utf8_len_unsafe (iter);
   }

   if (length) {
      *length = ret_length;
   }

   return ret;
}